

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

char * Bac_NtkGenerateName(Bac_Ntk_t *p,Bac_ObjType_t Type,Vec_Int_t *vBits)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *__s;
  size_t sVar4;
  char *pSymb;
  char *pName;
  int Bits;
  int i;
  char *pTemp;
  Vec_Int_t *vBits_local;
  Bac_ObjType_t Type_local;
  Bac_Ntk_t *p_local;
  
  pcVar3 = Bac_ManPrimName(p->pDesign,Type);
  __s = Bac_ManPrimSymb(p->pDesign,Type);
  iVar1 = Vec_IntSize(vBits);
  sVar4 = strlen(__s);
  if (iVar1 != (int)sVar4) {
    __assert_fail("Vec_IntSize(vBits) == (int)strlen(pSymb)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0x94,"char *Bac_NtkGenerateName(Bac_Ntk_t *, Bac_ObjType_t, Vec_Int_t *)");
  }
  sprintf(Bac_NtkGenerateName::Buffer,"%s%s_",s_Pref,pcVar3);
  sVar4 = strlen(Bac_NtkGenerateName::Buffer);
  _Bits = Bac_NtkGenerateName::Buffer + sVar4;
  for (pName._4_4_ = 0; iVar1 = Vec_IntSize(vBits), pName._4_4_ < iVar1;
      pName._4_4_ = pName._4_4_ + 1) {
    uVar2 = Vec_IntEntry(vBits,pName._4_4_);
    sprintf(_Bits,"%c%d",(ulong)(uint)(int)__s[pName._4_4_],(ulong)uVar2);
    sVar4 = strlen(_Bits);
    _Bits = _Bits + sVar4;
  }
  return Bac_NtkGenerateName::Buffer;
}

Assistant:

char * Bac_NtkGenerateName( Bac_Ntk_t * p, Bac_ObjType_t Type, Vec_Int_t * vBits )
{
    static char Buffer[100]; 
    char * pTemp; int i, Bits;
    char * pName = Bac_ManPrimName( p->pDesign, Type );
    char * pSymb = Bac_ManPrimSymb( p->pDesign, Type );
    assert( Vec_IntSize(vBits) == (int)strlen(pSymb) );
    sprintf( Buffer, "%s%s_", s_Pref, pName );
    pTemp = Buffer + strlen(Buffer);
    Vec_IntForEachEntry( vBits, Bits, i )
    {
        sprintf( pTemp, "%c%d", pSymb[i], Bits );
        pTemp += strlen(pTemp);
    }
    //Vec_IntPrint( vBits );
    //printf( "%s\n", Buffer );
    return Buffer;
}